

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
dynet::Model::serialize<boost::archive::text_oarchive>(Model *this,text_oarchive *ar,uint param_3)

{
  interface_oarchive<boost::archive::text_oarchive> *in_RDI;
  L2WeightDecay *in_stack_ffffffffffffffd8;
  
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            (in_RDI,(vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>
                     *)in_stack_ffffffffffffffd8);
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            (in_RDI,(vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *
                    )in_stack_ffffffffffffffd8);
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            (in_RDI,(vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                     *)in_stack_ffffffffffffffd8);
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            (in_RDI,in_stack_ffffffffffffffd8);
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            (in_RDI,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffd8
            );
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            (in_RDI,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffd8
            );
  return;
}

Assistant:

void Model::serialize(Archive& ar, const unsigned int) {
  ar & all_params;
  ar & params;
  ar & lookup_params;
  ar & weight_decay;
  // TODO do we want to save these or not?
  ar & updated_params;
  ar & updated_lookup_params;
}